

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# araplanner.cpp
# Opt level: O2

int __thiscall ARAPlanner::force_planning_from_scratch_and_free_memory(ARAPlanner *this)

{
  CMDPSTATE *pCVar1;
  DiscreteSpaceInformation *pDVar2;
  pointer ppiVar3;
  pointer ppiVar4;
  int *piVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  pCVar1 = this->pSearchStateSpace_->searchstartstate;
  uVar8 = 0xffffffff;
  uVar7 = uVar8;
  if (pCVar1 != (CMDPSTATE *)0x0) {
    uVar7 = pCVar1->StateID;
  }
  pCVar1 = this->pSearchStateSpace_->searchgoalstate;
  if (pCVar1 != (CMDPSTATE *)0x0) {
    uVar8 = pCVar1->StateID;
  }
  uVar6 = uVar8;
  if (this->bforwardsearch != false) {
    uVar6 = uVar7;
    uVar7 = uVar8;
  }
  (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x27])(this);
  (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x26])(this,this->pSearchStateSpace_);
  (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x2b])(this,this->pSearchStateSpace_);
  pDVar2 = (this->super_SBPLPlanner).environment_;
  ppiVar3 = (pDVar2->StateID2IndexMapping).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  ppiVar4 = (pDVar2->StateID2IndexMapping).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl
            .super__Vector_impl_data._M_finish;
  for (uVar8 = 0; (ulong)uVar8 < (ulong)((long)ppiVar4 - (long)ppiVar3 >> 3); uVar8 = uVar8 + 1) {
    piVar5 = ppiVar3[uVar8];
    piVar5[0] = -1;
    piVar5[1] = -1;
  }
  if (-1 < (int)uVar6) {
    (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[5])(this,(ulong)uVar6);
  }
  if (-1 < (int)uVar7) {
    (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[4])(this,(ulong)uVar7);
  }
  return 1;
}

Assistant:

int ARAPlanner::force_planning_from_scratch_and_free_memory()
{
    SBPL_PRINTF("planner: forceplanfromscratch set\n");
    int start_id = -1;
    int goal_id = -1;
    if (pSearchStateSpace_->searchstartstate)
        start_id = pSearchStateSpace_->searchstartstate->StateID;
    if (pSearchStateSpace_->searchgoalstate)
        goal_id = pSearchStateSpace_->searchgoalstate->StateID;

    if (!bforwardsearch) {
        int temp = start_id;
        start_id = goal_id;
        goal_id = temp;
    }

    DeleteSearchStateSpace(pSearchStateSpace_);
    CreateSearchStateSpace(pSearchStateSpace_);
    InitializeSearchStateSpace(pSearchStateSpace_);
    for (unsigned int i = 0; i < environment_->StateID2IndexMapping.size(); i++)
        for (int j = 0; j < NUMOFINDICES_STATEID2IND; j++)
            environment_->StateID2IndexMapping[i][j] = -1;

    if (start_id >= 0)
        set_start(start_id);
    if (goal_id >= 0)
        set_goal(goal_id);
    return 1;
}